

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O3

bool google::ParseEncoding(State *state)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  undefined8 uVar6;
  int iVar7;
  short sVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  long lVar12;
  char cVar13;
  State copy;
  undefined2 local_5a;
  undefined6 uStack_58;
  
  pcVar1 = state->mangled_cur;
  pcVar2 = state->out_cur;
  pcVar3 = state->out_begin;
  pcVar4 = state->out_end;
  pcVar5 = state->prev_name;
  iVar7 = state->prev_name_length;
  sVar8 = state->nest_level;
  bVar10 = state->append;
  bVar11 = state->overflowed;
  bVar9 = ParseName(state);
  if ((bVar9) && (bVar9 = ParseBareFunctionType(state), bVar9)) {
    return true;
  }
  state->prev_name = pcVar5;
  state->prev_name_length = iVar7;
  state->nest_level = sVar8;
  state->append = bVar10;
  state->overflowed = bVar11;
  state->out_begin = pcVar3;
  state->out_end = pcVar4;
  state->mangled_cur = pcVar1;
  state->out_cur = pcVar2;
  bVar10 = ParseName(state);
  bVar11 = true;
  if (!bVar10) {
    pcVar2 = state->mangled_cur;
    pcVar3 = state->out_cur;
    pcVar4 = state->out_begin;
    pcVar5 = state->out_end;
    uVar6 = *(undefined8 *)((long)&state->prev_name + 6);
    uStack_58 = (undefined6)((ulong)*(undefined8 *)((long)&state->out_end + 6) >> 0x10);
    local_5a = (undefined2)((ulong)pcVar5 >> 0x30);
    bVar10 = state->append;
    bVar11 = state->overflowed;
    pcVar1 = state->mangled_cur;
    if (*pcVar1 == 'T') {
      state->mangled_cur = pcVar1 + 1;
      cVar13 = 'V';
      lVar12 = 0;
      do {
        if (pcVar1[1] == cVar13) {
          state->mangled_cur = pcVar1 + 2;
          bVar9 = ParseType(state);
          if (bVar9) {
            return true;
          }
          break;
        }
        cVar13 = "VTIS"[lVar12 + 1];
        lVar12 = lVar12 + 1;
      } while (lVar12 != 4);
    }
    state->mangled_cur = pcVar2;
    state->out_cur = pcVar3;
    *(ulong *)((long)&state->out_end + 6) = CONCAT62(uStack_58,local_5a);
    *(undefined8 *)((long)&state->prev_name + 6) = uVar6;
    state->out_begin = pcVar4;
    state->out_end = pcVar5;
    state->append = bVar10;
    state->overflowed = bVar11;
    pcVar1 = state->mangled_cur;
    if ((*pcVar1 == 'T') && (pcVar1[1] == 'c')) {
      state->mangled_cur = pcVar1 + 2;
      bVar9 = ParseCallOffset(state);
      if ((bVar9) &&
         ((bVar9 = ParseCallOffset(state), bVar9 && (bVar9 = ParseEncoding(state), bVar9)))) {
        return true;
      }
    }
    state->mangled_cur = pcVar2;
    state->out_cur = pcVar3;
    *(ulong *)((long)&state->out_end + 6) = CONCAT62(uStack_58,local_5a);
    *(undefined8 *)((long)&state->prev_name + 6) = uVar6;
    state->out_begin = pcVar4;
    state->out_end = pcVar5;
    state->append = bVar10;
    state->overflowed = bVar11;
    pcVar1 = state->mangled_cur;
    if ((*pcVar1 == 'G') && (pcVar1[1] == 'V')) {
      state->mangled_cur = pcVar1 + 2;
      bVar9 = ParseName(state);
      if (bVar9) {
        return true;
      }
    }
    state->mangled_cur = pcVar2;
    state->out_cur = pcVar3;
    *(ulong *)((long)&state->out_end + 6) = CONCAT62(uStack_58,local_5a);
    *(undefined8 *)((long)&state->prev_name + 6) = uVar6;
    state->out_begin = pcVar4;
    state->out_end = pcVar5;
    state->append = bVar10;
    state->overflowed = bVar11;
    if (*state->mangled_cur == 'T') {
      state->mangled_cur = state->mangled_cur + 1;
      bVar9 = ParseCallOffset(state);
      if ((bVar9) && (bVar9 = ParseEncoding(state), bVar9)) {
        return true;
      }
    }
    state->mangled_cur = pcVar2;
    state->out_cur = pcVar3;
    *(ulong *)((long)&state->out_end + 6) = CONCAT62(uStack_58,local_5a);
    *(undefined8 *)((long)&state->prev_name + 6) = uVar6;
    state->out_begin = pcVar4;
    state->out_end = pcVar5;
    state->append = bVar10;
    state->overflowed = bVar11;
    pcVar1 = state->mangled_cur;
    if ((*pcVar1 == 'T') && (pcVar1[1] == 'C')) {
      state->mangled_cur = pcVar1 + 2;
      bVar9 = ParseType(state);
      if ((bVar9) &&
         ((bVar9 = ParseNumber(state,(int *)0x0), bVar9 && (*state->mangled_cur == '_')))) {
        state->mangled_cur = state->mangled_cur + 1;
        state->append = false;
        bVar9 = ParseType(state);
        if (bVar9) {
          state->append = (bool)(bVar10 & 1);
          return true;
        }
      }
    }
    state->mangled_cur = pcVar2;
    state->out_cur = pcVar3;
    *(ulong *)((long)&state->out_end + 6) = CONCAT62(uStack_58,local_5a);
    *(undefined8 *)((long)&state->prev_name + 6) = uVar6;
    state->out_begin = pcVar4;
    state->out_end = pcVar5;
    state->append = bVar10;
    state->overflowed = bVar11;
    pcVar1 = state->mangled_cur;
    if (*pcVar1 == 'T') {
      state->mangled_cur = pcVar1 + 1;
      if ((pcVar1[1] == 'J') || (pcVar1[1] == 'F')) {
        state->mangled_cur = pcVar1 + 2;
        bVar9 = ParseType(state);
        if (bVar9) {
          return true;
        }
      }
    }
    state->mangled_cur = pcVar2;
    state->out_cur = pcVar3;
    *(ulong *)((long)&state->out_end + 6) = CONCAT62(uStack_58,local_5a);
    *(undefined8 *)((long)&state->prev_name + 6) = uVar6;
    state->out_begin = pcVar4;
    state->out_end = pcVar5;
    state->append = bVar10;
    state->overflowed = bVar11;
    pcVar1 = state->mangled_cur;
    if ((*pcVar1 == 'G') && (pcVar1[1] == 'R')) {
      state->mangled_cur = pcVar1 + 2;
      bVar9 = ParseName(state);
      if (bVar9) {
        return true;
      }
    }
    state->mangled_cur = pcVar2;
    state->out_cur = pcVar3;
    *(ulong *)((long)&state->out_end + 6) = CONCAT62(uStack_58,local_5a);
    *(undefined8 *)((long)&state->prev_name + 6) = uVar6;
    state->out_begin = pcVar4;
    state->out_end = pcVar5;
    state->append = bVar10;
    state->overflowed = bVar11;
    pcVar1 = state->mangled_cur;
    if ((*pcVar1 == 'G') && (pcVar1[1] == 'A')) {
      state->mangled_cur = pcVar1 + 2;
      bVar9 = ParseEncoding(state);
      if (bVar9) {
        return true;
      }
    }
    state->mangled_cur = pcVar2;
    state->out_cur = pcVar3;
    *(ulong *)((long)&state->out_end + 6) = CONCAT62(uStack_58,local_5a);
    *(undefined8 *)((long)&state->prev_name + 6) = uVar6;
    state->out_begin = pcVar4;
    state->out_end = pcVar5;
    state->append = bVar10;
    state->overflowed = bVar11;
    pcVar1 = state->mangled_cur;
    if (*pcVar1 == 'T') {
      state->mangled_cur = pcVar1 + 1;
      if ((pcVar1[1] == 'v') || (pcVar1[1] == 'h')) {
        state->mangled_cur = pcVar1 + 2;
        bVar9 = ParseCallOffset(state);
        if ((bVar9) && (bVar9 = ParseEncoding(state), bVar9)) {
          return true;
        }
      }
    }
    *(ulong *)((long)&state->out_end + 6) = CONCAT62(uStack_58,local_5a);
    *(undefined8 *)((long)&state->prev_name + 6) = uVar6;
    state->out_begin = pcVar4;
    state->out_end = pcVar5;
    state->mangled_cur = pcVar2;
    state->out_cur = pcVar3;
    state->append = bVar10;
    state->overflowed = bVar11;
    bVar11 = false;
  }
  return bVar11;
}

Assistant:

static bool ParseEncoding(State *state) {
  State copy = *state;
  if (ParseName(state) && ParseBareFunctionType(state)) {
    return true;
  }
  *state = copy;

  if (ParseName(state) || ParseSpecialName(state)) {
    return true;
  }
  return false;
}